

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O1

bool __thiscall
duckdb::ChunkVectorInfo::Cleanup
          (ChunkVectorInfo *this,transaction_t lowest_transaction,
          unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *result)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (this->any_deleted == false) {
    if (this->same_inserted_id == false) {
      if (this->inserted[1] <= lowest_transaction) {
        uVar3 = 0;
        do {
          if (uVar3 == 0x7fe) {
            return true;
          }
          uVar1 = uVar3 + 1;
          lVar2 = uVar3 + 2;
          uVar3 = uVar1;
        } while (this->inserted[lVar2] <= lowest_transaction);
        if (0x7fe < uVar1) {
          return true;
        }
      }
    }
    else if (this->insert_id <= lowest_transaction) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ChunkVectorInfo::Cleanup(transaction_t lowest_transaction, unique_ptr<ChunkInfo> &result) const {
	if (any_deleted) {
		// if any rows are deleted we can't clean-up
		return false;
	}
	// check if the insertion markers have to be used by all transactions going forward
	if (!same_inserted_id) {
		for (idx_t idx = 1; idx < STANDARD_VECTOR_SIZE; idx++) {
			if (inserted[idx] > lowest_transaction) {
				// transaction was inserted after the lowest transaction start
				// we still need to use an older version - cannot compress
				return false;
			}
		}
	} else if (insert_id > lowest_transaction) {
		// transaction was inserted after the lowest transaction start
		// we still need to use an older version - cannot compress
		return false;
	}
	return true;
}